

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *value,
               serialization_category category,size_t serial_size)

{
  bool bVar1;
  binary_istream istream;
  fail_flag_serialization_policy local_80 [8];
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_78;
  array<std::byte,_1000UL> *local_40;
  undefined1 *local_38;
  fail_flag_serialization_policy local_30 [8];
  
  if (category != container) {
    __assert_fail("serialization_category_v<T> == category",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0xc,
                  "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]");
  }
  local_80[0].overflow = false;
  detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)local_80,value);
  if (local_80[0].overflow == true) {
    __assert_fail("!ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x10,
                  "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]");
  }
  if (((value->_M_t)._M_impl.super__Rb_tree_header._M_node_count & 0x1fffffffffffffff) !=
      0x1fffffffffffffff) {
    __assert_fail("size == get_serialized_size(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x13,
                  "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]");
  }
  if (serial_size == 0) {
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl._0_8_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40 = &buffer;
    local_38 = &_end;
    local_30[0].overflow = false;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    detail::operator>>((istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                        *)local_30,
                       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_78);
    if (local_40 != &buffer) {
      __assert_fail("ostream.data() == istream.data()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                    ,0x1a,
                    "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]")
      ;
    }
    if ((value->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        local_78._M_impl.super__Rb_tree_header._M_node_count) {
      bVar1 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                        ((value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)
                         &(value->_M_t)._M_impl.super__Rb_tree_header,
                         (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)
                         local_78._M_impl.super__Rb_tree_header._M_header._M_left);
      if (bVar1) {
        local_80[0].overflow = false;
        detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                            *)local_80,value);
        if (local_80[0].overflow != false) {
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree(&local_78);
          return;
        }
        __assert_fail("ostream.overflow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                      ,0x1f,
                      "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]"
                     );
      }
    }
    __assert_fail("value == value_copy",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x1b,
                  "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]");
  }
  __assert_fail("size == serial_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                ,0x14,
                "void test(const T &, serialization_category, size_t) [T = std::map<int, int>]");
}

Assistant:

void test(T const& value, serialization_category category, size_t serial_size) {
    assert(serialization_category_v<T> == category);

    auto ostream = binary_ostream{ buffer };
    ostream << value;
    assert(!ostream.overflow);

    size_t const size = ostream.data() - buffer.data();
    assert(size == get_serialized_size(value));
    assert(size == serial_size);

    auto value_copy = T{};
    auto istream = binary_istream{ buffer };
    istream >> value_copy;

    assert(ostream.data() == istream.data());
    assert(value == value_copy);

    ostream = { buffer.data(), serial_size - 1 };
    ostream << value;
    assert(ostream.overflow);
}